

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_CCtx_params params;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ZSTD_paramSwitch_e useRowMatchFinder;
  uint uVar4;
  ZSTD_CDict *cdict_00;
  size_t code;
  long lVar5;
  uint *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 in_stack_fffffffffffffd94;
  undefined1 auVar12 [24];
  undefined1 auVar13 [24];
  undefined1 in_stack_fffffffffffffdb0 [152];
  undefined1 local_17c [24];
  ZSTD_strategy local_164;
  undefined1 local_160 [24];
  ZSTD_strategy local_148;
  undefined1 local_144 [24];
  ZSTD_strategy local_12c;
  ZSTD_CDict *local_128;
  ZSTD_CDict *cdict;
  uint uStack_118;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params cctxParams;
  ZSTD_CCtx_params *originalCctxParams_local;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  
  bVar8 = 0;
  memcpy(&cParams.targetLength,originalCctxParams,0xd0);
  if ((customMem.customAlloc == (ZSTD_allocFunction)0x0) ==
      (customMem.customFree == (ZSTD_freeFunction)0x0)) {
    if (cctxParams.ldmParams.hashRateLog == 0) {
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)local_160,(ZSTD_CCtx_params *)&cParams.targetLength,
                 0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      cdict._4_4_ = local_160._0_4_;
      uStack_118 = local_160._4_4_;
      cParams.windowLog = local_160._8_4_;
      cParams.chainLog = local_160._12_4_;
      cParams.hashLog = local_160._16_4_;
      cParams.searchLog = local_160._20_4_;
      cParams.minMatch = local_148;
    }
    else {
      ZSTD_dedicatedDictSearch_getCParams
                ((ZSTD_compressionParameters *)local_144,cctxParams.fParams.checksumFlag,dictSize);
      cdict._4_4_ = local_144._0_4_;
      uStack_118 = local_144._4_4_;
      cParams.windowLog = local_144._8_4_;
      cParams.chainLog = local_144._12_4_;
      cParams.hashLog = local_144._16_4_;
      cParams.searchLog = local_144._20_4_;
      cParams.minMatch = local_12c;
      ZSTD_overrideCParams
                ((ZSTD_compressionParameters *)((long)&cdict + 4),
                 (ZSTD_compressionParameters *)&cParams.strategy);
    }
    iVar3 = ZSTD_dedicatedDictSearch_isSupported((ZSTD_compressionParameters *)((long)&cdict + 4));
    if (iVar3 == 0) {
      cctxParams.ldmParams.hashRateLog = 0;
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)local_17c,(ZSTD_CCtx_params *)&cParams.targetLength,
                 0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      cdict._4_4_ = local_17c._0_4_;
      uStack_118 = local_17c._4_4_;
      cParams.windowLog = local_17c._8_4_;
      cParams.chainLog = local_17c._12_4_;
      cParams.hashLog = local_17c._16_4_;
      cParams.searchLog = local_17c._20_4_;
      cParams.minMatch = local_164;
    }
    uVar4 = cParams.minMatch;
    uVar11 = cParams._8_8_;
    uVar10 = cParams._0_8_;
    cParams.strategy = cdict._4_4_;
    cctxParams.format = uStack_118;
    useRowMatchFinder =
         ZSTD_resolveRowMatchFinderMode
                   (cctxParams.validateSequences,(ZSTD_compressionParameters *)((long)&cdict + 4));
    uVar2 = cParams._8_8_;
    uVar1 = cParams._0_8_;
    cParams.windowLog = (uint)uVar10;
    cParams.chainLog = SUB84(uVar10,4);
    cParams_00.hashLog = cParams.windowLog;
    cParams_00.searchLog = cParams.chainLog;
    cParams_00.windowLog = cParams.strategy;
    cParams_00.chainLog = cctxParams.format;
    cParams.hashLog = (uint)uVar11;
    cParams.searchLog = SUB84(uVar11,4);
    cParams_00.minMatch = cParams.hashLog;
    cParams_00.targetLength = cParams.searchLog;
    cParams_00.strategy = uVar4;
    uVar9 = stack0xffffffffffffff04;
    cParams._0_8_ = uVar1;
    cParams._8_8_ = uVar2;
    cdict_00 = ZSTD_createCDict_advanced_internal
                         (dictSize,dictLoadMethod,cParams_00,useRowMatchFinder,
                          cctxParams.ldmParams.hashRateLog,customMem);
    puVar6 = &cParams.targetLength;
    puVar7 = (undefined8 *)&stack0xfffffffffffffd78;
    local_128 = cdict_00;
    for (lVar5 = 0x1a; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)puVar6;
      puVar6 = puVar6 + (ulong)bVar8 * -4 + 2;
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    params.cParams.chainLog = (uint)uVar10;
    params.cParams.hashLog = SUB84(uVar10,4);
    params.format = (uint)uVar9;
    params.cParams.windowLog = SUB84(uVar9,4);
    params.cParams.searchLog = (uint)uVar11;
    params.cParams.minMatch = SUB84(uVar11,4);
    params.cParams.targetLength = uVar4;
    params.cParams.strategy = in_stack_fffffffffffffd94;
    params.fParams._0_8_ = customMem.customAlloc;
    params._40_8_ = customMem.customFree;
    params._48_8_ = customMem.opaque;
    auVar12 = in_stack_fffffffffffffdb0._40_24_;
    auVar13 = in_stack_fffffffffffffdb0._96_24_;
    params.targetCBlockSize = in_stack_fffffffffffffdb0._0_8_;
    params.srcSizeHint = in_stack_fffffffffffffdb0._8_4_;
    params.attachDictPref = in_stack_fffffffffffffdb0._12_4_;
    params.literalCompressionMode = in_stack_fffffffffffffdb0._16_4_;
    params.nbWorkers = in_stack_fffffffffffffdb0._20_4_;
    params.jobSize = in_stack_fffffffffffffdb0._24_8_;
    params.overlapLog = in_stack_fffffffffffffdb0._32_4_;
    params.rsyncable = in_stack_fffffffffffffdb0._36_4_;
    params.ldmParams.enableLdm = auVar12._0_4_;
    params.ldmParams.hashLog = auVar12._4_4_;
    params.ldmParams.bucketSizeLog = auVar12._8_4_;
    params.ldmParams.minMatchLength = auVar12._12_4_;
    params.ldmParams.hashRateLog = auVar12._16_4_;
    params.ldmParams.windowLog = auVar12._20_4_;
    params.enableDedicatedDictSearch = in_stack_fffffffffffffdb0._64_4_;
    params.inBufferMode = in_stack_fffffffffffffdb0._68_4_;
    params.outBufferMode = in_stack_fffffffffffffdb0._72_4_;
    params.blockDelimiters = in_stack_fffffffffffffdb0._76_4_;
    params.validateSequences = in_stack_fffffffffffffdb0._80_4_;
    params.useBlockSplitter = in_stack_fffffffffffffdb0._84_4_;
    params.useRowMatchFinder = in_stack_fffffffffffffdb0._88_4_;
    params.deterministicRefPrefix = in_stack_fffffffffffffdb0._92_4_;
    params.customMem.customAlloc = (ZSTD_allocFunction)auVar13._0_8_;
    params.customMem.customFree = (ZSTD_freeFunction)auVar13._8_8_;
    params.customMem.opaque = (void *)auVar13._16_8_;
    params.prefetchCDictTables = in_stack_fffffffffffffdb0._120_4_;
    params.enableMatchFinderFallback = in_stack_fffffffffffffdb0._124_4_;
    params.useSequenceProducer = in_stack_fffffffffffffdb0._128_4_;
    params._188_4_ = in_stack_fffffffffffffdb0._132_4_;
    params.maxBlockSize = in_stack_fffffffffffffdb0._136_8_;
    params.searchForExternalRepcodes = in_stack_fffffffffffffdb0._144_4_;
    params._204_4_ = in_stack_fffffffffffffdb0._148_4_;
    code = ZSTD_initCDict_internal(cdict_00,dict,dictSize,dictLoadMethod,dictContentType,params);
    uVar4 = ERR_isError(code);
    if (uVar4 == 0) {
      dict_local = local_128;
    }
    else {
      ZSTD_freeCDict(local_128);
      dict_local = (void *)0x0;
    }
  }
  else {
    dict_local = (void *)0x0;
  }
  return (ZSTD_CDict *)dict_local;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}